

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grain_synthesis.c
# Opt level: O0

void extend_even(uint8_t *dst,int dst_stride,int width,int height,int use_high_bit_depth)

{
  int iVar1;
  uint in_ECX;
  uint in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int i_1;
  int i;
  int dst16_stride;
  uint16_t *dst16;
  undefined4 local_2c;
  undefined4 local_28;
  
  if (((in_EDX & 1) != 0) || ((in_ECX & 1) != 0)) {
    if (in_R8D == 0) {
      if ((in_EDX & 1) != 0) {
        for (local_2c = 0; local_2c < (int)in_ECX; local_2c = local_2c + 1) {
          *(undefined1 *)(in_RDI + (int)(local_2c * in_ESI + in_EDX)) =
               *(undefined1 *)(in_RDI + (int)(local_2c * in_ESI + in_EDX + -1));
        }
      }
      if ((in_ECX & 1) != 0) {
        memcpy((void *)(in_RDI + (int)(in_ECX * in_ESI)),
               (void *)(in_RDI + (int)((in_ECX - 1) * in_ESI)),(long)(int)(in_EDX + 1 & 0xfffffffe))
        ;
      }
    }
    else {
      iVar1 = in_ESI / 2;
      if ((in_EDX & 1) != 0) {
        for (local_28 = 0; local_28 < (int)in_ECX; local_28 = local_28 + 1) {
          *(undefined2 *)(in_RDI + (long)(int)(local_28 * iVar1 + in_EDX) * 2) =
               *(undefined2 *)(in_RDI + (long)(int)(local_28 * iVar1 + in_EDX + -1) * 2);
        }
      }
      if ((in_ECX & 1) != 0) {
        memcpy((void *)(in_RDI + (long)(int)(in_ECX * iVar1) * 2),
               (void *)(in_RDI + (long)(int)((in_ECX - 1) * iVar1) * 2),
               (long)(int)(in_EDX + 1 & 0xfffffffe) << 1);
      }
    }
  }
  return;
}

Assistant:

static void extend_even(uint8_t *dst, int dst_stride, int width, int height,
                        int use_high_bit_depth) {
  if ((width & 1) == 0 && (height & 1) == 0) return;
  if (use_high_bit_depth) {
    uint16_t *dst16 = (uint16_t *)dst;
    int dst16_stride = dst_stride / 2;
    if (width & 1) {
      for (int i = 0; i < height; ++i)
        dst16[i * dst16_stride + width] = dst16[i * dst16_stride + width - 1];
    }
    width = (width + 1) & (~1);
    if (height & 1) {
      memcpy(&dst16[height * dst16_stride], &dst16[(height - 1) * dst16_stride],
             sizeof(*dst16) * width);
    }
  } else {
    if (width & 1) {
      for (int i = 0; i < height; ++i)
        dst[i * dst_stride + width] = dst[i * dst_stride + width - 1];
    }
    width = (width + 1) & (~1);
    if (height & 1) {
      memcpy(&dst[height * dst_stride], &dst[(height - 1) * dst_stride],
             sizeof(*dst) * width);
    }
  }
}